

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

bool __thiscall rw::MaterialList::streamWrite(MaterialList *this,Stream *stream)

{
  uint32 size_00;
  int local_30;
  int local_2c;
  int32 j_1;
  int32 i_1;
  int32 j;
  int32 i;
  int32 idx;
  uint32 size;
  Stream *stream_local;
  MaterialList *this_local;
  
  size_00 = streamGetSize(this);
  writeChunkHeader(stream,8,size_00);
  writeChunkHeader(stream,1,this->numMaterials * 4 + 4);
  Stream::writeI32(stream,this->numMaterials);
  i_1 = 0;
  do {
    if (this->numMaterials <= i_1) {
      local_2c = 0;
      do {
        local_30 = local_2c;
        if (this->numMaterials <= local_2c) {
          return true;
        }
        do {
          local_30 = local_30 + -1;
          if (local_30 < 0) {
            Material::streamWrite(this->materials[local_2c],stream);
            break;
          }
        } while (this->materials[local_2c] != this->materials[local_30]);
        local_2c = local_2c + 1;
      } while( true );
    }
    j = -1;
    j_1 = i_1;
    do {
      j_1 = j_1 + -1;
      if (j_1 < 0) goto LAB_0010c0a6;
    } while (this->materials[i_1] != this->materials[j_1]);
    j = j_1;
LAB_0010c0a6:
    Stream::writeI32(stream,j);
    i_1 = i_1 + 1;
  } while( true );
}

Assistant:

bool
MaterialList::streamWrite(Stream *stream)
{
	uint32 size = this->streamGetSize();
	writeChunkHeader(stream, ID_MATLIST, size);
	writeChunkHeader(stream, ID_STRUCT, 4 + this->numMaterials*4);
	stream->writeI32(this->numMaterials);

	int32 idx;
	for(int32 i = 0; i < this->numMaterials; i++){
		idx = -1;
		for(int32 j = i-1; j >= 0; j--)
			if(this->materials[i] == this->materials[j]){
				idx = j;
				break;
			}
		stream->writeI32(idx);
	}
	for(int32 i = 0; i < this->numMaterials; i++){
		for(int32 j = i-1; j >= 0; j--)
			if(this->materials[i] == this->materials[j])
				goto found;
		this->materials[i]->streamWrite(stream);
		found:;
	}
	return true;
}